

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-gram.c
# Opt level: O1

void * ztparseAlloc(_func_void_ptr_size_t *mallocProc,ztparseinfo_t *info)

{
  yyParser *yypParser;
  long *plVar1;
  
  plVar1 = (long *)(*mallocProc)(0x660);
  if (plVar1 != (long *)0x0) {
    plVar1[2] = (long)info;
    *(undefined4 *)(plVar1 + 1) = 0xffffffff;
    *plVar1 = (long)(plVar1 + 3);
    *(undefined2 *)(plVar1 + 3) = 0;
    plVar1[0xcb] = (long)(plVar1 + 0xc9);
  }
  return plVar1;
}

Assistant:

void *ztparseAlloc(void *(*mallocProc)(YYMALLOCARGTYPE) ztparseCTX_PDECL){
  yyParser *yypParser;
  yypParser = (yyParser*)(*mallocProc)( (YYMALLOCARGTYPE)sizeof(yyParser) );
  if( yypParser ){
    ztparseCTX_STORE
    ztparseInit(yypParser ztparseCTX_PARAM);
  }
  return (void*)yypParser;
}